

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snp_vs_vcf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  pointer __last;
  char *pcVar2;
  pointer pbVar3;
  size_type sVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  istream *piVar10;
  int *piVar11;
  long *plVar12;
  ulong uVar13;
  difference_type __d_1;
  ulong uVar14;
  pointer pcVar15;
  int iVar16;
  long lVar17;
  string *this;
  ulong uVar18;
  call *pcVar19;
  ulong uVar20;
  long lVar21;
  difference_type __d;
  pointer pbVar22;
  long lVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  vector<call,_std::allocator<call>_> calls_vcf;
  string left_context;
  string DNA2;
  string right_context_1;
  string ALT;
  string line;
  int pos;
  string right_context;
  string left_context2;
  string left_context1;
  vector<call,_std::allocator<call>_> found_calls_vcf;
  string h2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contigs;
  vector<int,_std::allocator<int>_> assigned;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ref;
  string right_context2;
  string contig;
  set<int,_std::less<int>,_std::allocator<int>_> found;
  set<int,_std::less<int>,_std::allocator<int>_> found_nonisolated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  left_contexts;
  ifstream calls_file;
  ifstream vcf_file;
  ifstream ref_file;
  undefined1 auStack_cd8 [8];
  undefined8 local_cd0;
  vector<call,_std::allocator<call>_> local_cc8;
  char *local_ca8;
  ulong local_ca0;
  char local_c98 [16];
  char *local_c88;
  ulong local_c80;
  char local_c78 [16];
  undefined1 *local_c68;
  long local_c60;
  undefined1 local_c58 [16];
  byte *local_c48;
  long local_c40;
  byte local_c38 [16];
  char *local_c28;
  long local_c20;
  char local_c18 [16];
  long local_c08;
  int local_c00;
  undefined4 uStack_bfc;
  ulong local_bf8;
  undefined1 local_bf0 [16];
  byte *local_be0;
  undefined8 local_bd8;
  byte local_bd0 [16];
  undefined1 *local_bc0;
  ulong local_bb8;
  undefined1 local_bb0 [16];
  undefined1 *local_ba0;
  ulong local_b98;
  undefined1 local_b90 [16];
  long local_b80;
  long local_b78;
  int local_b6c;
  undefined1 local_b68 [32];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  char local_b28;
  char local_b27;
  undefined8 local_b20;
  undefined1 local_b18;
  undefined4 local_b14;
  double local_b08;
  double dStack_b00;
  char *local_af8;
  long local_af0;
  char local_ae8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ad8;
  vector<int,_std::allocator<int>_> local_ac0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_aa8;
  undefined1 *local_a78;
  ulong local_a70;
  undefined1 local_a68 [16];
  double local_a58;
  double dStack_a50;
  pointer local_a40;
  long local_a38;
  undefined1 local_a30 [88];
  long local_9d8;
  char local_9d0 [16];
  value_type local_9c0;
  undefined1 local_9a0 [32];
  _Alloc_hider local_980;
  size_type local_978;
  char local_970 [16];
  byte local_960;
  byte local_95f;
  uint64_t local_958;
  bool local_950;
  int local_94c;
  ios_base local_928 [264];
  undefined1 local_820 [32];
  _Rb_tree_node_base *local_800;
  size_t local_7f8;
  _Rb_tree_node_base local_7f0;
  undefined1 local_7d0;
  undefined4 local_7cc;
  ios_base local_7a8 [264];
  string local_6a0;
  string local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  value_type_conflict1 local_648;
  undefined4 uStack_644;
  byte abStack_628 [88];
  ios_base local_5d0 [400];
  key_type local_440;
  byte abStack_420 [488];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  byte abStack_218 [488];
  
  if (argc < 4) {
switchD_00104a0a_caseD_64:
    help();
LAB_00106dd9:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error: malformed SNP file. Two reads with different length in a SNP:\n",0x45);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_c48,local_c40);
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_ca8,local_ca0);
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_af8,local_af0);
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c88,local_c80);
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(1);
  }
LAB_001049ee:
  iVar7 = getopt(argc,argv,"hv:c:f:l:k:");
  switch(iVar7) {
  case 99:
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &calls_path_abi_cxx11_;
    break;
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
    goto switchD_00104a0a_caseD_64;
  case 0x66:
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &ref_path_abi_cxx11_;
    break;
  case 0x6b:
    k_nonis = atoi(_optarg);
    goto LAB_001049ee;
  case 0x6c:
    goto switchD_00104a0a_caseD_6c;
  default:
    if (iVar7 != 0x76) {
      if (iVar7 != -1) goto switchD_00104a0a_caseD_64;
      if (rlength == 0) {
        rlength = rlength_def;
      }
      if (k_nonis == 0) {
        k_nonis = k_nonis_def;
      }
      iVar7 = std::__cxx11::string::compare((char *)&vcf_path_abi_cxx11_);
      if (((iVar7 == 0) ||
          (iVar7 = std::__cxx11::string::compare((char *)&calls_path_abi_cxx11_), iVar7 == 0)) ||
         (iVar7 = std::__cxx11::string::compare((char *)&ref_path_abi_cxx11_), iVar7 == 0))
      goto switchD_00104a0a_caseD_64;
      local_aa8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_aa8._M_impl.super__Rb_tree_header._M_header;
      local_aa8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_aa8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_aa8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_aa8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_aa8._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading reference ... ",0x16);
      std::ostream::flush();
      std::ifstream::ifstream(local_238);
      std::ifstream::open((string *)local_238,0x10d218);
      local_c28 = local_c18;
      local_c20 = 0;
      local_c18[0] = '\0';
      local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
      local_9c0._M_string_length = 0;
      local_9c0.field_2._M_local_buf[0] = '\0';
      local_ad8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_ad8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_ad8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar17 = *(long *)(local_238[0] + -0x18);
      if ((abStack_218[lVar17] & 2) == 0) {
        do {
          cVar5 = std::ios::widen((char)auStack_cd8 + (char)lVar17 + -0x60);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_c28,cVar5);
          lVar17 = local_c20;
          pcVar2 = local_c28;
          if (*local_c28 == '>') {
            std::__cxx11::string::substr((ulong)&local_440,(ulong)&local_c28);
            std::__cxx11::string::operator=((string *)&local_9c0,(string *)&local_440);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_ad8,&local_9c0);
            local_440._M_string_length = 0;
            local_440.field_2._M_local_buf[0] = '\0';
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_aa8,&local_9c0);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_440);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
          }
          else {
            if (local_c20 != 0) {
              lVar23 = 0;
              do {
                iVar7 = toupper((int)pcVar2[lVar23]);
                pcVar2[lVar23] = (char)iVar7;
                lVar23 = lVar23 + 1;
              } while (lVar17 != lVar23);
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_aa8,&local_9c0);
            std::__cxx11::string::_M_append((char *)pmVar8,(ulong)local_c28);
          }
          lVar17 = *(long *)(local_238[0] + -0x18);
        } while ((abStack_218[lVar17] & 2) == 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Contig\tlength",0xd)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      pbVar3 = local_ad8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_ad8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_ad8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_c08 = 0;
      }
      else {
        local_c08 = 0;
        pbVar22 = local_ad8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          pcVar1 = (pbVar22->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_440,pcVar1,pcVar1 + pbVar22->_M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_440._M_dataplus._M_p,
                              local_440._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_aa8,&local_440);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_aa8,&local_440);
          local_c08 = local_c08 + pmVar8->_M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          pbVar22 = pbVar22 + 1;
        } while (pbVar22 != pbVar3);
      }
      std::ifstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading VCF ... ",0x10);
      std::ostream::flush();
      std::ifstream::ifstream(&local_440);
      std::ifstream::open((string *)&local_440,0x10d1d8);
      local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
      _M_start = (call *)0x0;
      local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
      _M_finish = (call *)0x0;
      local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      lVar17 = *(long *)(local_440._M_dataplus._M_p + -0x18);
      if ((abStack_420[lVar17] & 2) == 0) {
        local_b80 = 0;
        local_cd0 = 0.0;
        do {
          cVar5 = std::ios::widen((char)auStack_cd8 + (char)lVar17 + -0x68);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_440,(string *)&local_c28,cVar5);
          if ((local_c20 != 0) && (*local_c28 != '#')) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&local_648,(string *)&local_c28,_S_in);
            local_820._0_8_ = local_820 + 0x10;
            local_820._8_8_ = 0;
            local_820._16_8_ = local_820._16_8_ & 0xffffffffffffff00;
            local_b68._0_8_ = local_b68 + 0x10;
            local_b68._8_8_ = (pointer)0x0;
            local_b68._16_8_ = local_b68._16_8_ & 0xffffffffffffff00;
            local_be0 = local_bd0;
            local_bd8 = 0;
            local_bd0[0] = 0;
            local_c48 = local_c38;
            local_c40 = 0;
            local_c38[0] = 0;
            piVar10 = std::operator>>((istream *)&local_648,(string *)local_820);
            piVar10 = (istream *)std::istream::operator>>(piVar10,&local_c00);
            piVar10 = std::operator>>(piVar10,(string *)local_b68);
            piVar10 = std::operator>>(piVar10,(string *)&local_be0);
            std::operator>>(piVar10,(string *)&local_c48);
            local_c00 = local_c00 + -1;
            iVar7 = std::__cxx11::string::compare((char *)&local_be0);
            if (((iVar7 == 0) ||
                ((iVar7 = std::__cxx11::string::compare((char *)&local_be0), iVar7 == 0 ||
                 (iVar7 = std::__cxx11::string::compare((char *)&local_be0), iVar7 == 0)))) ||
               (iVar7 = std::__cxx11::string::compare((char *)&local_be0), iVar7 == 0)) {
              iVar7 = std::__cxx11::string::compare((char *)&local_c48);
              if ((((iVar7 == 0) ||
                   (iVar7 = std::__cxx11::string::compare((char *)&local_c48), iVar7 == 0)) ||
                  (iVar7 = std::__cxx11::string::compare((char *)&local_c48), iVar7 == 0)) ||
                 (iVar7 = std::__cxx11::string::compare((char *)&local_c48), iVar7 == 0)) {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_aa8,(key_type *)local_820);
                iVar7 = std::__cxx11::string::compare((char *)pmVar8);
                if (iVar7 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"WARNING: chromosome ",0x14);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(char *)local_820._0_8_,local_820._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," not found. ",0xc);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                }
                else {
                  uVar14 = (ulong)local_c00;
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&local_aa8,(key_type *)local_820);
                  if (pmVar8->_M_string_length <= uVar14) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"WARNING: position ",0x12);
                    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_c00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9," larger than chromosome ",0x18);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,(char *)local_820._0_8_,local_820._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'s length ",10);
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_aa8,(key_type *)local_820);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                  }
                  iVar16 = local_c00;
                  iVar7 = rlength;
                  if ((rlength <= local_c00) &&
                     (pmVar8 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&local_aa8,(key_type *)local_820),
                     (ulong)(long)(iVar7 + iVar16) < pmVar8->_M_string_length)) {
                    pmVar8 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_aa8,(key_type *)local_820);
                    std::__cxx11::string::substr((ulong)&local_c68,(ulong)pmVar8);
                    pmVar8 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_aa8,(key_type *)local_820);
                    std::__cxx11::string::substr((ulong)(local_a30 + 0x50),(ulong)pmVar8);
                    local_9a0._0_8_ = local_a30._80_8_ + local_9d8;
                    local_ca8 = local_c98;
                    local_c88 = (char *)local_a30._80_8_;
                    std::__cxx11::string::
                    _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                              ((string *)&local_ca8,local_9a0,&local_c88);
                    if ((char *)local_a30._80_8_ != local_9d0) {
                      operator_delete((void *)local_a30._80_8_);
                    }
                    local_9a0._0_8_ = local_9a0 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_9a0,local_c68,local_c68 + local_c60);
                    local_980._M_p = local_970;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_980,local_ca8,local_ca8 + local_ca0);
                    local_960 = *local_be0;
                    local_95f = *local_c48;
                    local_958 = (uint64_t)local_cd0;
                    local_950 = true;
                    local_94c = local_c00;
                    std::vector<call,_std::allocator<call>_>::emplace_back<call>
                              (&local_cc8,(call *)local_9a0);
                    if (local_980._M_p != local_970) {
                      operator_delete(local_980._M_p);
                    }
                    if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                      operator_delete((void *)local_9a0._0_8_);
                    }
                    pmVar8 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_aa8,(key_type *)local_820);
                    std::__cxx11::string::substr((ulong)&local_680,(ulong)pmVar8);
                    RC((string *)(local_a30 + 0x30),&local_680);
                    local_c88 = (char *)(local_a30._48_8_ + local_a30._56_8_);
                    local_af8 = (char *)local_a30._48_8_;
                    local_9a0._0_8_ = local_9a0 + 0x10;
                    std::__cxx11::string::
                    _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                              ((string *)local_9a0,&local_c88,&local_af8);
                    std::__cxx11::string::operator=((string *)&local_ca8,(string *)local_9a0);
                    if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                      operator_delete((void *)local_9a0._0_8_);
                    }
                    if ((undefined1 *)local_a30._48_8_ != local_a30 + 0x40) {
                      operator_delete((void *)local_a30._48_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_680._M_dataplus._M_p != &local_680.field_2) {
                      operator_delete(local_680._M_dataplus._M_p);
                    }
                    pmVar8 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_aa8,(key_type *)local_820);
                    std::__cxx11::string::substr((ulong)&local_6a0,(ulong)pmVar8);
                    RC((string *)local_9a0,&local_6a0);
                    std::__cxx11::string::operator=((string *)&local_c68,(string *)local_9a0);
                    if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                      operator_delete((void *)local_9a0._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                      operator_delete(local_6a0._M_dataplus._M_p);
                    }
                    local_9a0._0_8_ = local_9a0 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_9a0,local_c68,local_c68 + local_c60);
                    local_980._M_p = local_970;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_980,local_ca8,local_ca8 + local_ca0);
                    local_960 = *local_be0;
                    if (local_960 < 0x47) {
                      if (local_960 == 0x41) {
                        local_960 = 0x54;
                      }
                      else if (local_960 == 0x43) {
                        local_960 = 0x47;
                      }
                    }
                    else if (local_960 == 0x47) {
                      local_960 = 0x43;
                    }
                    else if (local_960 == 0x54) {
                      local_960 = 0x41;
                    }
                    local_95f = *local_c48;
                    if (local_95f < 0x47) {
                      if (local_95f == 0x41) {
                        local_95f = 0x54;
                      }
                      else if (local_95f == 0x43) {
                        local_95f = 0x47;
                      }
                    }
                    else if (local_95f == 0x47) {
                      local_95f = 0x43;
                    }
                    else if (local_95f == 0x54) {
                      local_95f = 0x41;
                    }
                    local_958 = (uint64_t)local_cd0;
                    local_950 = true;
                    local_94c = local_c00;
                    std::vector<call,_std::allocator<call>_>::emplace_back<call>
                              (&local_cc8,(call *)local_9a0);
                    if (local_980._M_p != local_970) {
                      operator_delete(local_980._M_p);
                    }
                    if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                      operator_delete((void *)local_9a0._0_8_);
                    }
                    if (local_ca8 != local_c98) {
                      operator_delete(local_ca8);
                    }
                    if (local_c68 != local_c58) {
                      operator_delete(local_c68);
                    }
                  }
                  local_b80 = local_b80 + 1;
                  local_cd0 = (double)((long)local_cd0 + 1);
                }
              }
            }
            if (local_c48 != local_c38) {
              operator_delete(local_c48);
            }
            if (local_be0 != local_bd0) {
              operator_delete(local_be0);
            }
            if ((pointer)local_b68._0_8_ != (pointer)(local_b68 + 0x10)) {
              operator_delete((void *)local_b68._0_8_);
            }
            if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
              operator_delete((void *)local_820._0_8_);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)&local_648);
            std::ios_base::~ios_base(local_5d0);
          }
          lVar17 = *(long *)(local_440._M_dataplus._M_p + -0x18);
        } while ((abStack_420[lVar17] & 2) == 0);
      }
      else {
        local_b80 = 0;
      }
      if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. "
                   ,0x61);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
      }
      iVar7 = k_nonis;
      uVar14 = ((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      iVar16 = 0;
      if (1 < uVar14) {
        uVar13 = uVar14 - 2;
        uVar18 = 2;
        if (uVar13 < 3) {
          uVar13 = 2;
        }
        piVar11 = &local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                   super__Vector_impl_data._M_start[4].pos;
        iVar16 = 0;
        do {
          if (uVar13 == uVar18) break;
          if ((uVar18 & 1) == 0) {
            if (piVar11[-0x2c] - piVar11[-0x58] < iVar7) {
              bVar24 = false;
            }
            else {
              bVar24 = iVar7 <= *piVar11 - piVar11[-0x2c];
            }
            *(bool *)(piVar11 + -0x2d) = bVar24;
            *(bool *)(piVar11 + -0x17) = bVar24;
            iVar16 = iVar16 + (uint)(bVar24 ^ 1);
          }
          uVar18 = uVar18 + 1;
          piVar11 = piVar11 + 0x16;
        } while (1 < uVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sorting VCF by context ... ",0x1b);
      std::ostream::flush();
      __last = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar15 = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar14 = ((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        lVar17 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(call_const&,call_const&)>>
                  ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                   local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                   local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                   super__Vector_impl_data._M_finish,(ulong)(((uint)lVar17 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_call_&,_const_call_&)>)0x1049a7);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(call_const&,call_const&)>>
                  ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)pcVar15,
                   (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)__last,
                   (_Iter_comp_iter<bool_(*)(const_call_&,_const_call_&)>)0x1049a7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::ifstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking calls ... ",0x13);
      std::ostream::flush();
      local_648 = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_ac0,
                 ((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,&local_648,
                 (allocator_type *)local_9a0);
      std::ifstream::ifstream(&local_648);
      std::ifstream::open((string *)&local_648,0x10d1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_660,2,(allocator_type *)local_9a0);
      local_be0 = local_bd0;
      local_bd8 = 0;
      local_bd0[0] = 0;
      cVar5 = std::ios::widen((char)(string *)&local_648 +
                              (char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_648,(string *)&local_c28,cVar5);
      local_b6c = iVar16;
      if ((abStack_628[*(long *)(CONCAT44(uStack_644,local_648) + -0x18)] & 2) == 0) {
        lVar23 = 0;
        lVar17 = 0;
        do {
          local_c48 = local_c38;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c48,local_c28,local_c28 + local_c20);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_9a0,(string *)&local_c28,_S_in);
          local_c68 = local_c58;
          local_c60 = 0;
          local_c58[0] = 0;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_9a0,(string *)&local_c68,'|');
          std::__cxx11::string::substr((ulong)local_820,(ulong)&local_c68);
          iVar7 = std::__cxx11::string::compare(local_820);
          if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
            operator_delete((void *)local_820._0_8_);
          }
          if (iVar7 == 0) {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_9a0,(string *)&local_c68,'|');
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_820,(string *)&local_c68,_S_in);
            std::__cxx11::istringstream::operator=
                      ((istringstream *)local_9a0,(istringstream *)local_820);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_820);
            std::ios_base::~ios_base(local_7a8);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_9a0,(string *)&local_c68,':');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_9a0,(string *)&local_c68,':');
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_820,(string *)&local_c68,_S_in);
            std::__cxx11::istringstream::operator=
                      ((istringstream *)local_9a0,(istringstream *)local_820);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_820);
            std::ios_base::~ios_base(local_7a8);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_9a0,(string *)&local_c68,'_');
            local_ca8 = local_c98;
            local_ca0 = 0;
            local_c98[0] = '\0';
            local_c88 = local_c78;
            local_c80 = 0;
            local_c78[0] = '\0';
            cVar5 = (char)(istream *)&local_648;
            cVar6 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    cVar5);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_ca8,cVar6);
            cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    cVar5);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_c88,cVar5);
            local_af8 = local_ae8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_af8,local_c88,local_c88 + local_c80);
            cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    (char)(istream *)&local_648);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_c88,cVar5);
            if (local_ca0 != local_c80) goto LAB_00106dd9;
            if (local_ca0 != 0) {
              dVar28 = 0.0;
              do {
                uVar14 = ~(ulong)dVar28;
                if (local_ca8[uVar14 + local_ca0] != local_c88[uVar14 + local_c80]) {
                  std::__cxx11::string::substr((ulong)&local_c00,(ulong)&local_ca8);
                  local_a58 = dVar28;
                  std::__cxx11::string::substr((ulong)&local_a78,(ulong)&local_c88);
                  std::__cxx11::string::substr((ulong)(local_a30 + 0x10),(ulong)&local_ca8);
                  local_820._0_8_ = local_a30._16_8_ + local_a30._24_8_;
                  local_b68._0_8_ = local_a30._16_8_;
                  local_ba0 = local_b90;
                  std::__cxx11::string::
                  _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                            ((string *)&local_ba0,local_820,local_b68);
                  if ((undefined1 *)local_a30._16_8_ != local_a30 + 0x20) {
                    operator_delete((void *)local_a30._16_8_);
                  }
                  std::__cxx11::string::substr((ulong)&local_a40,(ulong)&local_c88);
                  local_820._0_8_ = (long)&(local_a40->right_context)._M_dataplus._M_p + local_a38;
                  local_b68._0_8_ = local_a40;
                  local_bc0 = local_bb0;
                  std::__cxx11::string::
                  _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                            ((string *)&local_bc0,local_820,local_b68);
                  local_b08 = (double)lVar23;
                  if (local_a40 != (pointer)local_a30) {
                    operator_delete(local_a40);
                  }
                  cVar5 = local_ca8[uVar14 + local_ca0];
                  cVar6 = local_c88[uVar14 + local_c80];
                  local_820._0_8_ = local_820 + 0x10;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_820,CONCAT44(uStack_bfc,local_c00),
                             local_bf8 + CONCAT44(uStack_bfc,local_c00));
                  local_800 = &local_7f0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_800,local_ba0,local_ba0 + local_b98);
                  local_7f0._M_right = (_Base_ptr)0x0;
                  local_7d0 = 0;
                  local_7cc = 0;
                  local_b68._0_8_ = local_b68 + 0x10;
                  local_7f0._M_left._0_1_ = cVar5;
                  local_7f0._M_left._1_1_ = cVar6;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_b68,local_a78,local_a78 + local_a70);
                  local_b48[0] = local_b38;
                  local_b78 = lVar17;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_b48,local_bc0,local_bc0 + local_bb8);
                  local_b20 = 0;
                  local_b18 = 0;
                  local_b14 = 0;
                  pcVar15 = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_b28 = cVar5;
                  local_b27 = cVar6;
                  if (0 < (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                super__Vector_impl_data._M_start) {
                    uVar14 = ((ulong)((long)local_cc8.
                                            super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                     (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             0x2e8ba2e8ba2e8ba3;
                    do {
                      uVar13 = uVar14 >> 1;
                      iVar7 = std::__cxx11::string::compare((string *)(pcVar15 + uVar13));
                      if (iVar7 < 0) {
                        pcVar15 = pcVar15 + uVar13 + 1;
                        uVar13 = ~uVar13 + uVar14;
                      }
                      uVar14 = uVar13;
                    } while (0 < (long)uVar13);
                  }
                  uVar13 = ((long)pcVar15 -
                            (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
                  uVar18 = (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  uVar14 = ((long)uVar18 >> 3) * 0x2e8ba2e8ba2e8ba3;
                  if (uVar13 < uVar14) {
                    local_cd0 = (double)((ulong)local_cd0._4_4_ << 0x20);
                    do {
                      if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13].right_context._M_string_length <
                          local_bf8) break;
                      pcVar19 = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar13;
                      if (local_bf8 != 0) {
                        bVar24 = true;
                        uVar20 = 0;
                        do {
                          if (bVar24) {
                            bVar24 = *(char *)(CONCAT44(uStack_bfc,local_c00) + uVar20) ==
                                     (pcVar19->right_context)._M_dataplus._M_p[uVar20];
                          }
                          else {
                            bVar24 = false;
                          }
                          uVar20 = uVar20 + 1;
                        } while (local_bf8 != uVar20);
                        if (!bVar24) break;
                      }
                      if ((((pcVar19->ALT == cVar6) && (pcVar19->REF == cVar5)) ||
                          ((pcVar19->ALT == cVar5 && (pcVar19->REF == cVar6)))) &&
                         (local_b98 <= (pcVar19->left_context)._M_string_length)) {
                        if (local_b98 != 0) {
                          pcVar19 = (call *)(pcVar19->left_context)._M_dataplus._M_p;
                          bVar24 = true;
                          uVar20 = 0;
                          do {
                            if (bVar24) {
                              bVar24 = local_ba0[uVar20] ==
                                       *(char *)((long)&(pcVar19->right_context)._M_dataplus._M_p +
                                                uVar20);
                            }
                            else {
                              bVar24 = false;
                            }
                            uVar20 = uVar20 + 1;
                          } while (local_b98 != uVar20);
                          if (!bVar24) goto LAB_00106375;
                        }
                        local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13] = 1;
                        local_cd0 = (double)CONCAT44(local_cd0._4_4_,
                                                     (int)CONCAT71((int7)((ulong)pcVar19 >> 8),1));
                      }
LAB_00106375:
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != uVar14);
                  }
                  else {
                    local_cd0 = (double)((ulong)local_cd0._4_4_ << 0x20);
                  }
                  if ((char)local_cd0 == '\0') {
                    pcVar15 = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (0 < (long)uVar18) {
                      uVar14 = (uVar18 >> 3) * 0x2e8ba2e8ba2e8ba3;
                      do {
                        uVar13 = uVar14 >> 1;
                        iVar7 = std::__cxx11::string::compare((string *)(pcVar15 + uVar13));
                        if (iVar7 < 0) {
                          pcVar15 = pcVar15 + uVar13 + 1;
                          uVar13 = ~uVar13 + uVar14;
                        }
                        uVar14 = uVar13;
                      } while (0 < (long)uVar13);
                    }
                    uVar13 = ((long)pcVar15 -
                              (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x2e8ba2e8ba2e8ba3;
                    uVar14 = ((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x2e8ba2e8ba2e8ba3;
                    if (uVar13 < uVar14) {
                      do {
                        if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13].right_context._M_string_length
                            < local_a70) break;
                        pcVar19 = local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                  super__Vector_impl_data._M_start + uVar13;
                        if (local_a70 != 0) {
                          bVar24 = true;
                          uVar18 = 0;
                          do {
                            if (bVar24) {
                              bVar24 = local_a78[uVar18] ==
                                       (pcVar19->right_context)._M_dataplus._M_p[uVar18];
                            }
                            else {
                              bVar24 = false;
                            }
                            uVar18 = uVar18 + 1;
                          } while (local_a70 != uVar18);
                          if (!bVar24) break;
                        }
                        if ((((pcVar19->ALT == cVar6) && (pcVar19->REF == cVar5)) ||
                            ((pcVar19->ALT == cVar5 && (pcVar19->REF == cVar6)))) &&
                           (local_bb8 <= (pcVar19->left_context)._M_string_length)) {
                          if (local_bb8 != 0) {
                            pcVar19 = (call *)(pcVar19->left_context)._M_dataplus._M_p;
                            bVar24 = true;
                            uVar18 = 0;
                            do {
                              if (bVar24) {
                                bVar24 = local_bc0[uVar18] ==
                                         *(char *)((long)&(pcVar19->right_context)._M_dataplus._M_p
                                                  + uVar18);
                              }
                              else {
                                bVar24 = false;
                              }
                              uVar18 = uVar18 + 1;
                            } while (local_bb8 != uVar18);
                            if (!bVar24) goto LAB_001064f4;
                          }
                          local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13] = 1;
                          local_cd0 = (double)CONCAT44(local_cd0._4_4_,
                                                       (int)CONCAT71((int7)((ulong)pcVar19 >> 8),1))
                          ;
                        }
LAB_001064f4:
                        uVar13 = uVar13 + 1;
                      } while (uVar13 != uVar14);
                    }
                  }
                  lVar17 = local_b78;
                  if (local_b48[0] != local_b38) {
                    operator_delete(local_b48[0]);
                  }
                  dVar28 = local_b08;
                  if ((pointer)local_b68._0_8_ != (pointer)(local_b68 + 0x10)) {
                    operator_delete((void *)local_b68._0_8_);
                  }
                  if (local_800 != &local_7f0) {
                    operator_delete(local_800);
                  }
                  if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
                    operator_delete((void *)local_820._0_8_);
                  }
                  if (local_bc0 != local_bb0) {
                    operator_delete(local_bc0);
                  }
                  if (local_ba0 != local_b90) {
                    operator_delete(local_ba0);
                  }
                  if (local_a78 != local_a68) {
                    operator_delete(local_a78);
                  }
                  if ((undefined1 *)CONCAT44(uStack_bfc,local_c00) != local_bf0) {
                    operator_delete((undefined1 *)CONCAT44(uStack_bfc,local_c00));
                  }
                  lVar23 = (long)dVar28 + 1;
                  lVar17 = lVar17 + (ulong)(~SUB81(local_cd0,0) & 1);
                  dVar28 = local_a58;
                }
                dVar28 = (double)((long)dVar28 + 1);
              } while ((ulong)dVar28 < local_ca0);
            }
            if (local_af8 != local_ae8) {
              operator_delete(local_af8);
            }
            if (local_c88 != local_c78) {
              operator_delete(local_c88);
            }
            if (local_ca8 != local_c98) {
              operator_delete(local_ca8);
            }
          }
          else {
            cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    (char)&local_648);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_c28,cVar5);
            cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    (char)&local_648);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_c28,cVar5);
            cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                    (char)&local_648);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_648,(string *)&local_c28,cVar5);
          }
          cVar5 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18) +
                                  (char)&local_648);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_648,(string *)&local_c28,cVar5);
          if (local_c68 != local_c58) {
            operator_delete(local_c68);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_9a0);
          std::ios_base::~ios_base(local_928);
          if (local_c48 != local_c38) {
            operator_delete(local_c48);
          }
        } while ((abStack_628[*(long *)(CONCAT44(uStack_644,local_648) + -0x18)] & 2) == 0);
      }
      else {
        lVar17 = 0;
        lVar23 = 0;
      }
      local_b08 = (double)lVar23;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::ifstream::close();
      local_b68._0_8_ = (pointer)0x0;
      local_b68._8_8_ = (pointer)0x0;
      local_b68._16_8_ = (pointer)0x0;
      local_9a0._24_8_ = local_9a0 + 8;
      local_9a0._8_4_ = _S_red;
      local_9a0._16_8_ = 0;
      local_978 = 0;
      local_980._M_p = (pointer)local_9a0._24_8_;
      if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar23 = 0x12;
        uVar14 = 0;
        do {
          if (local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] != 0) {
            local_820._0_4_ =
                 *(undefined4 *)
                  ((long)&((local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start)->right_context)._M_dataplus._M_p +
                  lVar23 * 4);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_9a0,(int *)local_820);
          }
          uVar14 = uVar14 + 1;
          lVar23 = lVar23 + 0x16;
        } while (uVar14 < (ulong)(((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x2e8ba2e8ba2e8ba3));
      }
      local_820._24_8_ = local_820 + 8;
      local_820._8_8_ = local_820._8_8_ & 0xffffffff00000000;
      local_820._16_8_ = 0;
      local_7f8 = 0;
      local_800 = (_Rb_tree_node_base *)local_820._24_8_;
      if (local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar23 = 0x14;
        uVar14 = 0;
        do {
          if ((local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14] != 0) &&
             (*(char *)((long)&((local_cc8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_start)->right_context)._M_dataplus._M_p
                       + lVar23 * 4) == '\0')) {
            local_c48 = (byte *)CONCAT44(local_c48._4_4_,
                                         *(undefined4 *)
                                          ((long)local_cc8.
                                                 super__Vector_base<call,_std::allocator<call>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                          lVar23 * 4 + -8));
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_820,(int *)&local_c48);
          }
          uVar14 = uVar14 + 1;
          lVar23 = lVar23 + 0x16;
        } while (uVar14 < (ulong)(((long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_cc8.super__Vector_base<call,_std::allocator<call>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x2e8ba2e8ba2e8ba3));
      }
      sVar4 = local_978;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      lVar21 = local_b80;
      lVar23 = local_c08;
      std::ostream::put('P');
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Non-isolated SNPs detected: ",0x1c)
      ;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
      plVar12 = (long *)std::ostream::operator<<(poVar9,local_b6c);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TP = ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TN = ",5);
      lVar21 = lVar21 - sVar4;
      lVar23 = lVar23 - ((long)local_b08 + lVar21);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FP = ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FN = ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"sensitivity = TP/(TP+FN) = ",0x1b);
      auVar25._8_4_ = (int)(sVar4 >> 0x20);
      auVar25._0_8_ = sVar4;
      auVar25._12_4_ = 0x45300000;
      dStack_b00 = auVar25._8_8_ - 1.9342813113834067e+25;
      local_b08 = dStack_b00 + ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0);
      local_cd0 = local_b08 * 100.0;
      auVar26._8_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar26._0_8_ = lVar21;
      auVar26._12_4_ = 0x45300000;
      poVar9 = std::ostream::_M_insert<double>
                         (local_cd0 /
                          ((auVar26._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0) +
                          local_b08));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"specificity = TN/(TN+FP) = ",0x1b);
      auVar27._8_4_ = (int)((ulong)lVar23 >> 0x20);
      auVar27._0_8_ = lVar23;
      auVar27._12_4_ = 0x45300000;
      dVar28 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0);
      auVar29._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar29._0_8_ = lVar17;
      auVar29._12_4_ = 0x45300000;
      dStack_a50 = auVar29._8_8_ - 1.9342813113834067e+25;
      local_a58 = dStack_a50 + ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
      poVar9 = std::ostream::_M_insert<double>((dVar28 * 100.0) / (dVar28 + local_a58));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"precision   = TP/(TP+FP) = ",0x1b);
      poVar9 = std::ostream::_M_insert<double>(local_cd0 / (local_b08 + local_a58));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_820);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_9a0);
      std::vector<call,_std::allocator<call>_>::~vector
                ((vector<call,_std::allocator<call>_> *)local_b68);
      if (local_be0 != local_bd0) {
        operator_delete(local_be0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_660);
      std::ifstream::~ifstream(&local_648);
      if (local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_ac0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<call,_std::allocator<call>_>::~vector(&local_cc8);
      std::ifstream::~ifstream(&local_440);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_ad8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
        operator_delete(local_9c0._M_dataplus._M_p);
      }
      if (local_c28 != local_c18) {
        operator_delete(local_c28);
      }
      std::ifstream::~ifstream(local_238);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_aa8);
      return 0;
    }
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &vcf_path_abi_cxx11_;
  }
  std::__cxx11::string::operator=((string *)this,(string *)local_238);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0]);
  }
  goto LAB_001049ee;
switchD_00104a0a_caseD_6c:
  rlength = atoi(_optarg);
  goto LAB_001049ee;
}

Assistant:

int main(int argc, char** argv){

	if(argc < 4) help();

	int opt;
	while ((opt = getopt(argc, argv, "hv:c:f:l:k:")) != -1){
		switch (opt){
			case 'h':
				help();
			break;
			case 'v':
				vcf_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'c':
				calls_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'f':
				ref_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'l':
				rlength = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'k':
				k_nonis = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			default:
				help();
			return -1;
		}
	}

	rlength = rlength == 0 ? rlength_def : rlength;
	k_nonis = k_nonis == 0 ? k_nonis_def : k_nonis;

	if(vcf_path.compare("")==0 or calls_path.compare("")==0 or ref_path.compare("")==0) help();

	//reference indexed by contig: e.g. string chr1 = ref["chr1"]
	std::map<string,string> ref;

	cout << "Loading reference ... " << flush;

	/*
	 *
	 * READ REFERENCE, LOAD CONTIGS IN MEMORY
	 *
	 */
	ifstream ref_file;
	ref_file.open(ref_path, ios::in);

	string line;
	string contig;

	vector<string> contigs;

	int nonisolated_snps=0;

	while(not ref_file.eof()){

		getline(ref_file, line);

		if(line[0] == '>'){//new contig name

			contig = line.substr(1);
			contigs.push_back(contig);

			ref[contig] = string();

		}else{

			for (auto & c: line) c = toupper(c);
			ref[contig].append(line);

		}

	}

	cout << "done." << endl;

	uint64_t N = 0;

	cout << "Contig\tlength" << endl;
	for(auto c : contigs){

		cout << c << "\t" << ref[c].length() << endl;

		N+=ref[c].length();

	}
	//cout << endl;

	ref_file.close();


	/*
	 * LOAD SNPS FROM VCF
	 */

	cout << "Loading VCF ... " << flush;

	uint64_t n_snps=0;//number of SNPs in the VCF

	//read vcf
	ifstream vcf_file;
	vcf_file.open(vcf_path, ios::in);

	vector<call> calls_vcf;
	uint64_t ID = 0;

	while(not vcf_file.eof()){

		getline(vcf_file, line);

		if(line.size()>0 and line[0] != '#'){

			std::istringstream is( line );

			string chr;
			int pos;
			string id;
			string REF;
			string ALT;

			is >> chr >> pos >> id >> REF >> ALT;

			pos--;//coordinates are 1-based in the vcf file

			//keep just SNPs
			if(		(REF.compare("A")==0 or REF.compare("C")==0 or REF.compare("T")==0 or REF.compare("G")==0) and
					(ALT.compare("A")==0 or ALT.compare("C")==0 or ALT.compare("T")==0 or ALT.compare("G")==0)
			){

				if(ref[chr].compare("")!=0){//if chromosome exists in the reference file

					n_snps++;

					//insert forward call

					if(pos >= ref[chr].size()){

						cout << "WARNING: position " << pos << " larger than chromosome " << chr << "'s length " << ref[chr].size() << endl;

					}

					if(pos >= rlength && pos+rlength < ref[chr].size()){

						assert(pos+1<ref[chr].size());
						assert(pos+1+rlength<=ref[chr].size());
						assert(pos>=rlength);
						assert(pos-rlength<ref[chr].size());
						assert(pos<=ref[chr].size());

						string right_context = ref[chr].substr(pos+1,rlength);
						string left_context = REV(ref[chr].substr(pos-rlength,rlength));

						assert(REF.size()>0);
						assert(ALT.size()>0);

						calls_vcf.push_back(call {right_context, left_context, REF[0], ALT[0], ID, true, pos});

						//insert RC call

						left_context = REV(RC(ref[chr].substr(pos+1,rlength)));
						right_context = RC(ref[chr].substr(pos-rlength,rlength));

						calls_vcf.push_back(call {right_context, left_context, RC(REF[0]), RC(ALT[0]), ID, true, pos});

					}

					++ID;

				}else{

					cout << "WARNING: chromosome " << chr << " not found. " << endl;

				}

			}

		}

	}


	if(calls_vcf.size()==0){

		cout << "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. " << endl;

	}

	for(int i=2;calls_vcf.size() > 1 && i<calls_vcf.size()-2;++i){

		if(i%2==0){

			calls_vcf[i].isolated = calls_vcf[i].pos - calls_vcf[i-2].pos >= k_nonis and calls_vcf[i+2].pos - calls_vcf[i].pos >= k_nonis;
			calls_vcf[i+1].isolated = calls_vcf[i].isolated;

			if(not calls_vcf[i].isolated){

				//cout << calls_vcf[i].pos - calls_vcf[i-2].pos << " " << calls_vcf[i+2].pos - calls_vcf[i].pos << endl;
				nonisolated_snps++;

			}

		}

	}

	cout << "done." << endl;

	cout << "Sorting VCF by context ... " << flush;
	std::sort(calls_vcf.begin(), calls_vcf.end(), comp);
	cout << "done." << endl;

	vcf_file.close();

	//vector<call> calls;

	/*
	 *
	 * LOAD CALLS FROM FASTA GENERATED BY SNP-CALLING TOOL, SEARCH THEM IN THE RANGE STRUCTURE OF
	 * CONTAINING VCF CALLS
	 *
	 */

	uint64_t n_calls = 0;//number of SNPs in input fasta file (including hidden SNPs inside the sequences)

	cout << "Checking calls ... " << flush;

	uint64_t FP = 0;
	uint64_t FN = 0;
	uint64_t TP = 0;
	uint64_t TN = 0;

	auto assigned = vector<int>(calls_vcf.size(),0);

	//read calls
	ifstream calls_file;
	calls_file.open(calls_path, ios::in);

	//left/right contexts per sample
	vector<string> left_contexts = vector<string>(2);
	string right_context;

	getline(calls_file, line);

	int last_id = 0;
	int non_isolated_SNPs = 0;

	while(not calls_file.eof()){

		//header of first read

		string h1=line;

		std::istringstream is( line );
		string pos;
		getline(is,pos,'|');

		if(pos.substr(0,4).compare(">SNP")==0){//filter out indels

			getline(is,pos,'|');

			is = istringstream(pos);
			getline(is,pos,':');
			getline(is,pos,':');

			is = istringstream(pos);
			getline(is,pos,'_');

			int ipos = atoi(pos.c_str());//position of leftmost SNP
			ipos = 0;

			string DNA1, DNA2;
			getline(calls_file, DNA1);//DNA of first read

			getline(calls_file, DNA2);//skip header of second read
			string h2=DNA2;

			getline(calls_file, DNA2);//DNA of second read

			//some consistency checks on the file

			/*if(DNA1.substr(DNA1.size() - ipos).compare(DNA2.substr(DNA2.size() - ipos)) != 0){

				cout << "Error: malformed SNP file. Last " << ipos << " bases do not coincide\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			if(DNA1.length()!=DNA2.length()){

				cout << "Error: malformed SNP file. Two reads with different length in a SNP:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}

			/*if(DNA1[DNA1.size()-ipos-1] == DNA2[DNA2.size()-ipos-1]){

				cout << "Error: malformed SNP file. No SNP at specified position:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			//search all SNPs from the leftmost backwards
			while(ipos<DNA1.size()){

				//if SNP found
				if(DNA1[DNA1.size()-ipos-1] != DNA2[DNA2.size()-ipos-1]){

					n_calls++;

					string right_context1 = DNA1.substr(DNA1.size()-ipos);
					string right_context2 = DNA2.substr(DNA2.size()-ipos);

					string left_context1 = REV(DNA1.substr(0, DNA1.size()-ipos-1));
					string left_context2 = REV(DNA2.substr(0, DNA2.size()-ipos-1));

					char REF = DNA1[DNA1.size()-ipos-1];
					char ALT = DNA2[DNA2.size()-ipos-1];

					call c1 = {right_context1, left_context1, REF, ALT, 0, false};
					call c2 = {right_context2, left_context2, REF, ALT, 0, false};

					non_isolated_SNPs++;

					//Search c1 in the range structure

					auto it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c1, comp);

					uint64_t idx = std::distance(calls_vcf.begin(), it);

					bool found = false;

					/*
					 * while right context of c1 prefixes right context in range of VCF calls
					 */

					while(idx < calls_vcf.size() and is_prefix(right_context1, calls_vcf[idx].right_context)){

						if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
							(is_prefix(left_context1, calls_vcf[idx].left_context))	){

							found = true;
							assigned[idx] = 1;

						}

						++idx;

					}

					if(not found){

						//Search c2 in the range structure

						it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c2, comp);

						idx = std::distance(calls_vcf.begin(), it);

						/*
						 * while right context of c2 prefixes right context in range of VCF calls
						 */
						while(idx < calls_vcf.size() and is_prefix(right_context2, calls_vcf[idx].right_context)){

							if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
								(is_prefix(left_context2, calls_vcf[idx].left_context))	){

								found = true;
								assigned[idx] = 1;

							}

							++idx;

						}

					}

					if(not found) FP++;

				}

				++ipos;

			}

			non_isolated_SNPs--;

		}else{

			//skip event

			getline(calls_file, line);//DNA of first read
			getline(calls_file, line);//header of second read
			getline(calls_file, line);//DNA of second read

		}

		getline(calls_file, line);//header of first read

	}

	cout << "done." << endl;

	calls_file.close();



	vector<call> found_calls_vcf;//count how many SNPs in the VCF have been found

	std::set<int> found;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i]){

			found.insert(calls_vcf[i].ID);

		}

	}

	//nonisolated SNPs found
	std::set<int> found_nonisolated;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i] and not calls_vcf[i].isolated){

			found_nonisolated.insert(calls_vcf[i].ID);

		}

	}

	TP = found.size();

	//number of true SNPs that are not found
	FN = n_snps - TP;

	//this is a lower bound because we may call multiple times the same SNP
	TN = (N - n_calls) -  FN;

	cout << endl << "Non-isolated SNPs detected: " << found_nonisolated.size()  << "/" << nonisolated_snps << endl;

	cout << endl;
	cout << "TP = " << TP << endl;
	cout << "TN = " << TN << endl;
	cout << "FP = " << FP << endl;
	cout << "FN = " << FN << endl;

	cout << "sensitivity = TP/(TP+FN) = " << 100*double(TP)/(double(TP)+double(FN)) << "%" << endl;
	cout << "specificity = TN/(TN+FP) = " << 100*double(TN)/(double(TN)+double(FP)) << "%" << endl;
	cout << "precision   = TP/(TP+FP) = " << 100*double(TP)/(double(TP)+double(FP)) << "%" << endl;



}